

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

void * __thiscall cnn::SharedAllocator::malloc(SharedAllocator *this,size_t __size)

{
  void *pvVar1;
  ostream *poVar2;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pvVar1 = mmap((void *)0x0,__size,3,0x21,-1,0);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Shared memory allocation failed n=",0x22);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Shared memory allocation failed","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_003105a8;
  __cxa_throw(this_00,&out_of_memory::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void* SharedAllocator::malloc(size_t n) {
  void* ptr = mmap(NULL, n, PROT_READ|PROT_WRITE, MAP_ANON|MAP_SHARED, -1, 0);
  if (!ptr) {
    cerr << "Shared memory allocation failed n=" << n << endl;
    throw cnn::out_of_memory("Shared memory allocation failed");
  }
  return ptr;
}